

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O3

void __thiscall imrt::ACO::globalDeposit(ACO *this,Ant *a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  long lVar5;
  long lVar6;
  key_type_conflict local_5c;
  double local_58;
  Ant *local_50;
  long local_48;
  long local_40;
  double local_38;
  
  local_58 = Ant::getEvaluation(a);
  iVar2 = Collimator::getNbAngles(this->collimator);
  if (0 < iVar2) {
    local_58 = 1.0 / local_58;
    lVar6 = 0;
    local_50 = a;
    do {
      local_5c = 0;
      if (0 < a->n_apertures) {
        local_40 = lVar6 * 0x10;
        local_48 = lVar6 * 0x30;
        do {
          lVar1 = local_40;
          iVar2 = Collimator::getIntensityLevelSize(this->collimator);
          if (0 < iVar2) {
            iVar2 = 0;
            do {
              iVar3 = Ant::getIntensityReferenceAt(a,(int)lVar6,local_5c);
              lVar5 = *(long *)(*(long *)((long)&((this->ipheromone).
                                                  super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->p +
                                         lVar1) + (long)local_5c * 8);
              *(double *)(lVar5 + (long)iVar3 * 8) = *(double *)(lVar5 + (long)iVar3 * 8) + local_58
              ;
              iVar2 = iVar2 + 1;
              iVar3 = Collimator::getIntensityLevelSize(this->collimator);
            } while (iVar2 < iVar3);
          }
          iVar2 = Collimator::getXdim(this->collimator);
          lVar1 = local_48;
          if (0 < iVar2) {
            lVar5 = 0;
            do {
              iVar2 = Ant::getReferenceAt(local_50,(int)lVar6,local_5c,(int)lVar5);
              pmVar4 = std::
                       map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                       ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                     *)((long)&(((this->pheromone).
                                                 super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                               _M_impl.field_0x0 + lVar1),&local_5c);
              local_38 = pmVar4->p[lVar5][iVar2] + local_58;
              pmVar4 = std::
                       map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                       ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                     *)((long)&(((this->pheromone).
                                                 super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                               _M_impl.field_0x0 + lVar1),&local_5c);
              pmVar4->p[lVar5][iVar2] = local_38;
              lVar5 = lVar5 + 1;
              iVar2 = Collimator::getXdim(this->collimator);
              a = local_50;
            } while (lVar5 < iVar2);
          }
          local_5c = local_5c + 1;
        } while (local_5c < a->n_apertures);
      }
      lVar6 = lVar6 + 1;
      iVar2 = Collimator::getNbAngles(this->collimator);
    } while (lVar6 < iVar2);
  }
  return;
}

Assistant:

void globalDeposit (Ant * a) {
    int raux;
    double deposit = 1/a->getEvaluation();
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      for (int ap = 0; ap < a->n_apertures; ap++) {
        // Intensity pheromone deposit
        for (int i =0; i <  collimator.getIntensityLevelSize(); i++) {
          raux = a->getIntensityReferenceAt(s,ap);
          ipheromone[s](ap,raux) = ipheromone[s](ap,raux) + deposit;
        }
        // Aperture pheromone deposit
        for (int j = 0; j < collimator.getXdim(); j++) {
          raux = a->getReferenceAt(s,ap,j);
          (pheromone[s])[ap](j,raux) = (pheromone[s])[ap](j,raux) + deposit;
        }
      }
    }
  }